

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O2

uint32_t sse::Sum(uint32_t rowSize,uint8_t *imageY,uint8_t *imageYEnd,uint32_t simdWidth,
                 uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint8_t *puVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [64];
  
  puVar4 = imageY + totalSimdWidth;
  auVar8 = ZEXT1664((undefined1  [16])0x0);
  iVar5 = 0;
  for (; imageY != imageYEnd; imageY = imageY + rowSize) {
    lVar6 = 0;
    while ((ulong)simdWidth << 4 != lVar6) {
      pauVar1 = (undefined1 (*) [16])(imageY + lVar6);
      lVar6 = lVar6 + 0x10;
      auVar2 = vpmovzxbw_avx(*pauVar1);
      auVar3 = vpunpckhbw_avx(*pauVar1,(undefined1  [16])0x0);
      auVar2 = vpaddw_avx(auVar2,auVar3);
      auVar3 = vpmovzxwd_avx(auVar2);
      auVar2 = vpunpckhwd_avx(auVar2,(undefined1  [16])0x0);
      auVar2 = vpaddd_avx(auVar8._0_16_,auVar2);
      auVar2 = vpaddd_avx(auVar2,auVar3);
      auVar8 = ZEXT1664(auVar2);
    }
    if (nonSimdWidth != 0) {
      for (uVar7 = 0; nonSimdWidth != uVar7; uVar7 = uVar7 + 1) {
        iVar5 = iVar5 + (uint)puVar4[uVar7];
      }
    }
    puVar4 = puVar4 + rowSize;
  }
  auVar2 = vphaddd_avx(auVar8._0_16_,auVar8._0_16_);
  auVar2 = vphaddd_avx(auVar2,auVar2);
  return auVar2._0_4_ + iVar5;
}

Assistant:

uint32_t Sum( uint32_t rowSize, const uint8_t * imageY, const uint8_t * imageYEnd, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        uint32_t sum = 0;
        simd simdSum = _mm_setzero_si128();
        simd zero    = _mm_setzero_si128();

        for( ; imageY != imageYEnd; imageY += rowSize ) {
            const simd * src    = reinterpret_cast <const simd*> (imageY);
            const simd * srcEnd = src + simdWidth;

            for( ; src != srcEnd; ++src ) {
                simd data = _mm_loadu_si128( src );

                simd dataLo  = _mm_unpacklo_epi8( data, zero );
                simd dataHi  = _mm_unpackhi_epi8( data, zero );
                simd sumLoHi = _mm_add_epi16( dataLo, dataHi );

                simdSum = _mm_add_epi32( simdSum, _mm_add_epi32( _mm_unpacklo_epi16( sumLoHi, zero ),
                                                                 _mm_unpackhi_epi16( sumLoHi, zero ) ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * imageX    = imageY + totalSimdWidth;
                const uint8_t * imageXEnd = imageX + nonSimdWidth;

                for( ; imageX != imageXEnd; ++imageX )
                    sum += (*imageX);
            }
        }

        uint32_t output[4] ={ 0 };

        _mm_storeu_si128( reinterpret_cast <simd*>(output), simdSum );

        return sum + output[0] + output[1] + output[2] + output[3];
    }